

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.h
# Opt level: O3

void __thiscall
InfoRecord::InfoRecord
          (InfoRecord *this,HighsInfoType Xtype,string *Xname,string *Xdescription,bool Xadvanced)

{
  this->_vptr_InfoRecord = (_func_int **)&PTR__InfoRecord_00440d78;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  this->type = Xtype;
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::_M_assign((string *)&this->description);
  this->advanced = Xadvanced;
  return;
}

Assistant:

InfoRecord(HighsInfoType Xtype, std::string Xname, std::string Xdescription,
             bool Xadvanced) {
    this->type = Xtype;
    this->name = Xname;
    this->description = Xdescription;
    this->advanced = Xadvanced;
  }